

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Encode.cpp
# Opt level: O0

void idx2::Dealloc(encode_data *E)

{
  i64 iVar1;
  i64 iVar2;
  undefined8 *puVar3;
  hash_table<unsigned_int,_idx2::channel> *Ht;
  hash_table<unsigned_int,_idx2::channel> *extraout_RDX;
  hash_table<unsigned_int,_idx2::channel> *Ht_00;
  hash_table<unsigned_long,_idx2::sub_channel> *Ht_01;
  hash_table<unsigned_long,_idx2::sub_channel> *extraout_RDX_00;
  hash_table<unsigned_long,_idx2::sub_channel> *Ht_02;
  hash_table<unsigned_long,_idx2::chunk_meta_info> *Ht_03;
  hash_table<unsigned_long,_idx2::chunk_meta_info> *extraout_RDX_01;
  hash_table<unsigned_long,_idx2::chunk_meta_info> *Ht_04;
  hash_table<unsigned_long,_idx2::chunk_exp_info> *extraout_RDX_02;
  hash_table<unsigned_long,_idx2::chunk_exp_info> *Ht_05;
  iterator local_1a8;
  undefined1 local_188 [8];
  iterator ChunkExpIt;
  chunk_meta_info *local_158;
  hash_table<unsigned_long,_idx2::chunk_meta_info> *local_150;
  undefined1 local_148 [8];
  iterator ChunkMetaIt;
  sub_channel *local_118;
  hash_table<unsigned_long,_idx2::sub_channel> *local_110;
  undefined1 local_108 [8];
  iterator SubChannelIt;
  channel *local_d8;
  hash_table<unsigned_int,_idx2::channel> *local_d0;
  undefined1 local_c8 [8];
  iterator ChannelIt;
  encode_data *E_local;
  
  ChannelIt.Idx = (i64)E;
  (*E->Alloc->_vptr_allocator[2])();
  Dealloc<unsigned_long,idx2::brick_volume>
            ((hash_table<unsigned_long,_idx2::brick_volume> *)(ChannelIt.Idx + 8));
  Begin<unsigned_int,idx2::channel>((iterator *)local_c8,(idx2 *)(ChannelIt.Idx + 0x38),Ht);
  Ht_00 = extraout_RDX;
  while (End<unsigned_int,idx2::channel>
                   ((iterator *)&SubChannelIt.Idx,(idx2 *)(ChannelIt.Idx + 0x38),Ht_00),
        ChannelIt.Val != local_d8 || ChannelIt.Ht != local_d0) {
    Dealloc((channel *)ChannelIt.Key);
    do {
      ChannelIt.Ht = (hash_table<unsigned_int,_idx2::channel> *)((long)&(ChannelIt.Ht)->Keys + 1);
    } while (*(char *)((long)&(ChannelIt.Ht)->Keys +
                      (long)&(((ChannelIt.Val)->BrickDeltasStream).Stream.Alloc)->_vptr_allocator)
             != '\x02');
    local_c8 = (undefined1  [8])
               (((ChannelIt.Val)->BrickDeltasStream).Stream.Data + (long)ChannelIt.Ht * 4);
    Ht_00 = (hash_table<unsigned_int,_idx2::channel> *)((long)ChannelIt.Ht * 0xd8);
    ChannelIt.Key = (uint *)((long)&Ht_00->Keys + ((ChannelIt.Val)->BrickDeltasStream).Stream.Bytes)
    ;
  }
  Dealloc<unsigned_int,idx2::channel>
            ((hash_table<unsigned_int,_idx2::channel> *)(ChannelIt.Idx + 0x38));
  Begin<unsigned_long,idx2::sub_channel>((iterator *)local_108,(idx2 *)(ChannelIt.Idx + 0x68),Ht_01)
  ;
  Ht_02 = extraout_RDX_00;
  while (End<unsigned_long,idx2::sub_channel>
                   ((iterator *)&ChunkMetaIt.Idx,(idx2 *)(ChannelIt.Idx + 0x68),Ht_02),
        SubChannelIt.Val != local_118 || SubChannelIt.Ht != local_110) {
    Dealloc((sub_channel *)SubChannelIt.Key);
    do {
      SubChannelIt.Ht =
           (hash_table<unsigned_long,_idx2::sub_channel> *)((long)&(SubChannelIt.Ht)->Keys + 1);
    } while (*(char *)((long)&(SubChannelIt.Ht)->Keys +
                      (long)&(((SubChannelIt.Val)->BlockExpStream).Stream.Alloc)->_vptr_allocator)
             != '\x02');
    local_108 = (undefined1  [8])
                (((SubChannelIt.Val)->BlockExpStream).Stream.Data + (long)SubChannelIt.Ht * 8);
    Ht_02 = (hash_table<unsigned_long,_idx2::sub_channel> *)((long)SubChannelIt.Ht * 0x70);
    SubChannelIt.Key =
         (unsigned_long *)((long)&Ht_02->Keys + ((SubChannelIt.Val)->BlockExpStream).Stream.Bytes);
  }
  Dealloc<unsigned_long,idx2::sub_channel>
            ((hash_table<unsigned_long,_idx2::sub_channel> *)(ChannelIt.Idx + 0x68));
  iVar1 = ChannelIt.Idx;
  (**(code **)(**(long **)(ChannelIt.Idx + 0x368) + 8))
            (*(long **)(ChannelIt.Idx + 0x368),ChannelIt.Idx + 0x340);
  iVar2 = ChannelIt.Idx;
  *(undefined8 *)(iVar1 + 0x360) = 0;
  *(undefined8 *)(iVar1 + 0x358) = 0;
  (**(code **)(**(long **)(ChannelIt.Idx + 0x398) + 8))
            (*(long **)(ChannelIt.Idx + 0x398),ChannelIt.Idx + 0x370);
  *(undefined8 *)(iVar2 + 0x390) = 0;
  *(undefined8 *)(iVar2 + 0x388) = 0;
  Begin<unsigned_long,idx2::chunk_meta_info>
            ((iterator *)local_148,(idx2 *)(ChannelIt.Idx + 0x1f0),Ht_03);
  Ht_04 = extraout_RDX_01;
  while( true ) {
    End<unsigned_long,idx2::chunk_meta_info>
              ((iterator *)&ChunkExpIt.Idx,(idx2 *)(ChannelIt.Idx + 0x1f0),Ht_04);
    if (ChunkMetaIt.Val == local_158 && ChunkMetaIt.Ht == local_150) break;
    Dealloc((chunk_meta_info *)ChunkMetaIt.Key);
    do {
      ChunkMetaIt.Ht =
           (hash_table<unsigned_long,_idx2::chunk_meta_info> *)((long)&(ChunkMetaIt.Ht)->Keys + 1);
    } while (*(char *)((long)&(ChunkMetaIt.Ht)->Keys +
                      (long)&(((ChunkMetaIt.Val)->Addrs).Buffer.Alloc)->_vptr_allocator) != '\x02');
    local_148 = (undefined1  [8])(((ChunkMetaIt.Val)->Addrs).Buffer.Data + (long)ChunkMetaIt.Ht * 8)
    ;
    Ht_04 = (hash_table<unsigned_long,_idx2::chunk_meta_info> *)((long)ChunkMetaIt.Ht * 0x60);
    ChunkMetaIt.Key =
         (unsigned_long *)((long)&Ht_04->Keys + ((ChunkMetaIt.Val)->Addrs).Buffer.Bytes);
  }
  Begin<unsigned_long,idx2::chunk_exp_info>
            ((iterator *)local_188,(idx2 *)(ChannelIt.Idx + 0x220),
             (hash_table<unsigned_long,_idx2::chunk_exp_info> *)&ChunkExpIt.Idx);
  Ht_05 = extraout_RDX_02;
  while (End<unsigned_long,idx2::chunk_exp_info>(&local_1a8,(idx2 *)(ChannelIt.Idx + 0x220),Ht_05),
        ChunkExpIt.Val != (chunk_exp_info *)local_1a8.Ht ||
        ChunkExpIt.Ht != (hash_table<unsigned_long,_idx2::chunk_exp_info> *)local_1a8.Idx) {
    Dealloc((chunk_exp_info *)ChunkExpIt.Key);
    do {
      ChunkExpIt.Ht =
           (hash_table<unsigned_long,_idx2::chunk_exp_info> *)((long)&(ChunkExpIt.Ht)->Keys + 1);
    } while (*(char *)((long)&(ChunkExpIt.Ht)->Keys +
                      (long)&(((ChunkExpIt.Val)->ExpSizes).Stream.Alloc)->_vptr_allocator) != '\x02'
            );
    local_188 = (undefined1  [8])
                (((ChunkExpIt.Val)->ExpSizes).Stream.Data + (long)ChunkExpIt.Ht * 8);
    Ht_05 = (hash_table<unsigned_long,_idx2::chunk_exp_info> *)((long)ChunkExpIt.Ht * 0x90);
    ChunkExpIt.Key =
         (unsigned_long *)((long)&Ht_05->Keys + ((ChunkExpIt.Val)->ExpSizes).Stream.Bytes);
  }
  Dealloc<unsigned_long,idx2::chunk_meta_info>
            ((hash_table<unsigned_long,_idx2::chunk_meta_info> *)(ChannelIt.Idx + 0x1f0));
  iVar1 = ChannelIt.Idx;
  puVar3 = (undefined8 *)(ChannelIt.Idx + 0x250);
  (**(code **)(**(long **)(ChannelIt.Idx + 0x260) + 8))(*(long **)(ChannelIt.Idx + 0x260),puVar3);
  iVar2 = ChannelIt.Idx;
  *(undefined8 *)(iVar1 + 0x268) = *puVar3;
  *(undefined4 *)(iVar1 + 0x278) = 0;
  *(undefined8 *)(iVar1 + 0x270) = 0;
  puVar3 = (undefined8 *)(ChannelIt.Idx + 0x280);
  (**(code **)(**(long **)(ChannelIt.Idx + 0x290) + 8))(*(long **)(ChannelIt.Idx + 0x290),puVar3);
  iVar1 = ChannelIt.Idx;
  *(undefined8 *)(iVar2 + 0x298) = *puVar3;
  *(undefined4 *)(iVar2 + 0x2a8) = 0;
  *(undefined8 *)(iVar2 + 0x2a0) = 0;
  puVar3 = (undefined8 *)(ChannelIt.Idx + 0x2b0);
  (**(code **)(**(long **)(ChannelIt.Idx + 0x2c0) + 8))(*(long **)(ChannelIt.Idx + 0x2c0),puVar3);
  iVar2 = ChannelIt.Idx;
  *(undefined8 *)(iVar1 + 0x2c8) = *puVar3;
  *(undefined4 *)(iVar1 + 0x2d8) = 0;
  *(undefined8 *)(iVar1 + 0x2d0) = 0;
  (**(code **)(**(long **)(ChannelIt.Idx + 0x308) + 8))
            (*(long **)(ChannelIt.Idx + 0x308),ChannelIt.Idx + 0x2e0);
  iVar1 = ChannelIt.Idx;
  *(undefined8 *)(iVar2 + 0x300) = 0;
  *(undefined8 *)(iVar2 + 0x2f8) = 0;
  (**(code **)(**(long **)(ChannelIt.Idx + 0x338) + 8))
            (*(long **)(ChannelIt.Idx + 0x338),ChannelIt.Idx + 0x310);
  *(undefined8 *)(iVar1 + 0x330) = 0;
  *(undefined8 *)(iVar1 + 0x328) = 0;
  return;
}

Assistant:

void
Dealloc(encode_data* E)
{
  E->Alloc->DeallocAll();
  Dealloc(&E->BrickPool);
  idx2_ForEach (ChannelIt, E->Channels)
    Dealloc(ChannelIt.Val);
  Dealloc(&E->Channels);
  idx2_ForEach (SubChannelIt, E->SubChannels)
    Dealloc(SubChannelIt.Val);
  Dealloc(&E->SubChannels);
  Dealloc(&E->SortedChannels);
  Dealloc(&E->SortedSubChannels);
  idx2_ForEach (ChunkMetaIt, E->ChunkMeta)
    Dealloc(ChunkMetaIt.Val);
  idx2_ForEach (ChunkExpIt, E->ChunkExponents)
    Dealloc(ChunkExpIt.Val);
  Dealloc(&E->ChunkMeta);
  //Dealloc(&E->CompressedExps);
  Dealloc(&E->CompressedChunkAddresses);
  Dealloc(&E->ChunkStream);
  Dealloc(&E->ChunkExpStream);
  Dealloc(&E->LastSigBlock);
  Dealloc(&E->SubbandExps);
  //Dealloc(&E->BlockStream);
}